

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# force_ip.cc
# Opt level: O2

void __thiscall
rcdiscover::ForceIP::sendCommand
          (ForceIP *this,uint64_t mac,uint32_t ip,uint32_t subnet,uint32_t gateway)

{
  pointer pSVar1;
  pointer this_00;
  allocator_type local_4a;
  uchar local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> force_ip_command;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&force_ip_command,0x40,&local_4a);
  *force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 'B';
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\x04';
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '8';
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = (uchar)(mac >> 0x28);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = (uchar)(mac >> 0x20);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = (uchar)(mac >> 0x18);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = (uchar)(mac >> 0x10);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = (uchar)(mac >> 8);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = (uchar)mac;
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = (uchar)(ip >> 0x18);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = (uchar)(ip >> 0x10);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = (uchar)(ip >> 8);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = (uchar)ip;
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = (uchar)(subnet >> 0x18);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = (uchar)(subnet >> 0x10);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = (uchar)(subnet >> 8);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = (uchar)subnet;
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = (uchar)(gateway >> 0x18);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = (uchar)(gateway >> 0x10);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = (uchar)(gateway >> 8);
  force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = (uchar)gateway;
  pSVar1 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->sockets_).
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1
      ) {
    GigERequestCounter::getNext();
    force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = local_49;
    *(allocator_type *)
     (force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 7) = local_4a;
    SocketLinux::sendImpl(this_00,&force_ip_command);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&force_ip_command.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void ForceIP::sendCommand(const uint64_t mac, const uint32_t ip,
                          const uint32_t subnet, const uint32_t gateway)
{
  std::vector<std::uint8_t> force_ip_command(64);
  force_ip_command[0] = 0x42;
  force_ip_command[1] = 0x00;   // flags
  force_ip_command[2] = 0x00;   // command: FORCEIP_CMD: 0x0004
  force_ip_command[3] = 0x04;   // command: FORCEIP_CMD: 0x0004
  force_ip_command[4] = 0x00;   // length
  force_ip_command[5] = 64 - 8; // length

  force_ip_command[10] = static_cast<std::uint8_t>(mac >> 40); // MAC address
  force_ip_command[11] = static_cast<std::uint8_t>(mac >> 32); // MAC address
  force_ip_command[12] = static_cast<std::uint8_t>(mac >> 24); // MAC address
  force_ip_command[13] = static_cast<std::uint8_t>(mac >> 16); // MAC address
  force_ip_command[14] = static_cast<std::uint8_t>(mac >> 8);  // MAC address
  force_ip_command[15] = static_cast<std::uint8_t>(mac >> 0);  // MAC address

  force_ip_command[28] = static_cast<std::uint8_t>(ip >> 24); // IP address
  force_ip_command[29] = static_cast<std::uint8_t>(ip >> 16); // IP address
  force_ip_command[30] = static_cast<std::uint8_t>(ip >> 8);  // IP address
  force_ip_command[31] = static_cast<std::uint8_t>(ip >> 0);  // IP address

  force_ip_command[44] = static_cast<std::uint8_t>(subnet >> 24); // subnet
  force_ip_command[45] = static_cast<std::uint8_t>(subnet >> 16); // subnet
  force_ip_command[46] = static_cast<std::uint8_t>(subnet >> 8);  // subnet
  force_ip_command[47] = static_cast<std::uint8_t>(subnet >> 0);  // subnet

  force_ip_command[60] = static_cast<std::uint8_t>(gateway >> 24); // gateway
  force_ip_command[61] = static_cast<std::uint8_t>(gateway >> 16); // gateway
  force_ip_command[62] = static_cast<std::uint8_t>(gateway >> 8);  // gateway
  force_ip_command[63] = static_cast<std::uint8_t>(gateway >> 0);  // gateway

  for (auto &socket : sockets_)
  {
    std::tie(force_ip_command[6], force_ip_command[7]) =
        GigERequestCounter::getNext();

    try
    {
      socket.send(force_ip_command);
    }
    catch(const NetworkUnreachableException &)
    {
      continue;
    }
  }
}